

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::ClearBit
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  byte bVar1;
  uint32 uVar2;
  LogMessage *other;
  uint32 *puVar3;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (*(char *)(*(long *)(field + 0x80) + 0x6f) == '\x01') {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x7f6);
    other = LogMessage::operator<<(&local_60,"CHECK failed: !field->options().weak(): ");
    LogFinisher::operator=(&local_61,other);
    LogMessage::~LogMessage(&local_60);
  }
  if ((this->schema_).has_bits_offset_ != -1) {
    uVar2 = ReflectionSchema::HasBitIndex(&this->schema_,field);
    bVar1 = (byte)uVar2 & 0x1f;
    puVar3 = MutableHasBits(this,message);
    puVar3[uVar2 >> 5] = puVar3[uVar2 >> 5] & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
  }
  return;
}

Assistant:

inline void GeneratedMessageReflection::ClearBit(
    Message* message, const FieldDescriptor* field) const {
  GOOGLE_DCHECK(!field->options().weak());
  if (!schema_.HasHasbits()) {
    return;
  }
  const uint32 index = schema_.HasBitIndex(field);
  MutableHasBits(message)[index / 32] &=
      ~(static_cast<uint32>(1) << (index % 32));
}